

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::GetBooleanValueOld
          (cmConditionEvaluator *this,cmExpandedCommandArgument *arg,bool one)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,one) == 0) {
    pcVar3 = GetDefinitionIfUnquoted(this,arg);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = cmExpandedCommandArgument::c_str(arg);
      iVar2 = atoi(pcVar3);
      if (iVar2 == 0) {
        pcVar3 = (char *)0x0;
      }
      else {
        pcVar3 = cmExpandedCommandArgument::c_str(arg);
      }
    }
  }
  else {
    bVar1 = cmExpandedCommandArgument::operator==(arg,"0");
    if (bVar1) {
      return false;
    }
    bVar1 = cmExpandedCommandArgument::operator==(arg,"1");
    if (bVar1) {
      return true;
    }
    pcVar3 = GetDefinitionIfUnquoted(this,arg);
  }
  bVar1 = cmSystemTools::IsOff(pcVar3);
  return !bVar1;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValueOld(
  cmExpandedCommandArgument const& arg, bool one) const
{
  if (one) {
    // Old IsTrue behavior for single argument.
    if (arg == "0") {
      return false;
    }
    if (arg == "1") {
      return true;
    }
    const char* def = this->GetDefinitionIfUnquoted(arg);
    return !cmSystemTools::IsOff(def);
  }
  // Old GetVariableOrNumber behavior.
  const char* def = this->GetDefinitionIfUnquoted(arg);
  if (!def && atoi(arg.c_str())) {
    def = arg.c_str();
  }
  return !cmSystemTools::IsOff(def);
}